

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_connection.c
# Opt level: O1

ngx_listening_t * ngx_create_listening(ngx_conf_t *cf,sockaddr *sockaddr,socklen_t socklen)

{
  sa_family_t sVar1;
  ngx_listening_t *__s;
  sockaddr *sa;
  size_t size;
  u_char *__dest;
  u_char local_b8 [8];
  u_char text [113];
  
  __s = (ngx_listening_t *)ngx_array_push(&cf->cycle->listening);
  if (__s != (ngx_listening_t *)0x0) {
    memset(__s,0,0xe0);
    sa = (sockaddr *)ngx_palloc(cf->pool,(ulong)socklen);
    if (sa != (sockaddr *)0x0) {
      memcpy(sa,sockaddr,(ulong)socklen);
      __s->sockaddr = sa;
      __s->socklen = socklen;
      size = ngx_sock_ntop(sa,socklen,local_b8,0x71,1);
      (__s->addr_text).len = size;
      sVar1 = __s->sockaddr->sa_family;
      if (sVar1 == 1) {
        __s->addr_text_max_len = 0x71;
        size = size + 1;
      }
      else if (sVar1 == 2) {
        __s->addr_text_max_len = 0xf;
      }
      else if (sVar1 == 10) {
        __s->addr_text_max_len = 0x2d;
      }
      else {
        __s->addr_text_max_len = 0x71;
      }
      __dest = (u_char *)ngx_pnalloc(cf->pool,size);
      (__s->addr_text).data = __dest;
      if (__dest != (u_char *)0x0) {
        memcpy(__dest,local_b8,size);
        __s->fd = -1;
        __s->type = 1;
        __s->backlog = 0x1ff;
        __s->rcvbuf = -1;
        __s->sndbuf = -1;
        __s->fastopen = -1;
        return __s;
      }
    }
  }
  return (ngx_listening_t *)0x0;
}

Assistant:

ngx_listening_t *
ngx_create_listening(ngx_conf_t *cf, struct sockaddr *sockaddr,
    socklen_t socklen)
{
    size_t            len;
    ngx_listening_t  *ls;
    struct sockaddr  *sa;
    u_char            text[NGX_SOCKADDR_STRLEN];

    ls = ngx_array_push(&cf->cycle->listening);
    if (ls == NULL) {
        return NULL;
    }

    ngx_memzero(ls, sizeof(ngx_listening_t));

    sa = ngx_palloc(cf->pool, socklen);
    if (sa == NULL) {
        return NULL;
    }

    ngx_memcpy(sa, sockaddr, socklen);

    ls->sockaddr = sa;
    ls->socklen = socklen;

    len = ngx_sock_ntop(sa, socklen, text, NGX_SOCKADDR_STRLEN, 1);
    ls->addr_text.len = len;

    switch (ls->sockaddr->sa_family) {
#if (NGX_HAVE_INET6)
    case AF_INET6:
        ls->addr_text_max_len = NGX_INET6_ADDRSTRLEN;
        break;
#endif
#if (NGX_HAVE_UNIX_DOMAIN)
    case AF_UNIX:
        ls->addr_text_max_len = NGX_UNIX_ADDRSTRLEN;
        len++;
        break;
#endif
    case AF_INET:
        ls->addr_text_max_len = NGX_INET_ADDRSTRLEN;
        break;
    default:
        ls->addr_text_max_len = NGX_SOCKADDR_STRLEN;
        break;
    }

    ls->addr_text.data = ngx_pnalloc(cf->pool, len);
    if (ls->addr_text.data == NULL) {
        return NULL;
    }

    ngx_memcpy(ls->addr_text.data, text, len);

    ls->fd = (ngx_socket_t) -1;
    ls->type = SOCK_STREAM;

    ls->backlog = NGX_LISTEN_BACKLOG;
    ls->rcvbuf = -1;
    ls->sndbuf = -1;

#if (NGX_HAVE_SETFIB)
    ls->setfib = -1;
#endif

#if (NGX_HAVE_TCP_FASTOPEN)
    ls->fastopen = -1;
#endif

    return ls;
}